

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::readFrameProperties(DumpReader *this,istream *inputStream)

{
  string *str;
  Snapshot *this_00;
  RealType RVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  char *__s;
  Mat3x3d hmat;
  string line;
  string propertyName;
  StringTokenizer tokenizer;
  undefined1 local_118 [80];
  string local_c8;
  string local_a8;
  StringTokenizer local_88;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::clearDerivedProperties(this_00);
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_118 + 0x50),__s,(allocator<char> *)&local_88);
  lVar4 = std::__cxx11::string::find((char *)(local_118 + 0x50),0x2690b4);
  if (lVar4 == -1) {
    builtin_strncpy(painCave.errMsg,"DumpReader Error: Missing <FrameData>\n",0x27);
    painCave.isFatal = 1;
    simError();
  }
  str = (string *)(local_118 + 0x50);
  local_118._72_8_ = inputStream;
  while( true ) {
    plVar5 = (long *)std::istream::getline((char *)inputStream,(long)__s);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::assign((char *)str);
    lVar4 = std::__cxx11::string::find((char *)str,0x2690e7);
    if (lVar4 != -1) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118," ;\t\n\r{}:,",(allocator<char> *)&local_a8);
    StringTokenizer::StringTokenizer(&local_88,str,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    bVar2 = StringTokenizer::hasMoreTokens(&local_88);
    if (!bVar2) {
      snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
               local_c8._M_dataplus._M_p);
      inputStream = (istream *)local_118._72_8_;
      painCave.isFatal = 1;
      simError();
    }
    StringTokenizer::nextToken_abi_cxx11_(&local_a8,&local_88);
    bVar2 = std::operator==(&local_a8,"Time");
    if (bVar2) {
      RVar1 = StringTokenizer::nextTokenAsDouble(&local_88);
      Snapshot::setTime(this_00,RVar1);
    }
    else {
      bVar2 = std::operator==(&local_a8,"Hmat");
      if (bVar2) {
        SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)local_118);
        local_118._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._8_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._16_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._24_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._32_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._40_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._48_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._56_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._64_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        Snapshot::setHmat(this_00,(Mat3x3d *)local_118);
      }
      else {
        bVar2 = std::operator==(&local_a8,"Thermostat");
        if (bVar2) {
          local_118._0_8_ = (pointer)0x0;
          local_118._8_8_ = (pointer)0x0;
          local_118._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
          local_118._8_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
          Snapshot::setThermostat(this_00,(pair<double,_double> *)local_118);
        }
        else {
          bVar2 = std::operator==(&local_a8,"Barostat");
          if (bVar2) {
            SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)local_118);
            local_118._0_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._8_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._16_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._24_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._32_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._40_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._48_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._56_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._64_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            Snapshot::setBarostat(this_00,(Mat3x3d *)local_118);
          }
          else {
            bVar2 = std::operator==(&local_a8,"SPFData");
            if (bVar2) {
              Snapshot::getSPFData((Snapshot *)local_118);
              RVar1 = StringTokenizer::nextTokenAsDouble(&local_88);
              ((Vector<double,_3U> *)local_118._0_8_)->data_[0] = RVar1;
              RVar1 = StringTokenizer::nextTokenAsDouble(&local_88);
              ((Vector<double,_3U> *)local_118._0_8_)->data_[1] = RVar1;
              RVar1 = StringTokenizer::nextTokenAsDouble(&local_88);
              ((Vector<double,_3U> *)local_118._0_8_)->data_[2] = RVar1;
              RVar1 = StringTokenizer::nextTokenAsDouble(&local_88);
              (((pointer)(local_118._0_8_ + 0x18))->super_Vector<double,_3U>).data_[0] = RVar1;
              iVar3 = StringTokenizer::nextTokenAsInt(&local_88);
              *(int *)((((pointer)(local_118._0_8_ + 0x18))->super_Vector<double,_3U>).data_ + 1) =
                   iVar3;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
            }
            else {
              snprintf(painCave.errMsg,2000,
                       "DumpReader Error: %s is an invalid property in <FrameData>\n",
                       local_a8._M_dataplus._M_p);
              inputStream = (istream *)local_118._72_8_;
              painCave.isFatal = 0;
              simError();
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_a8);
    StringTokenizer::~StringTokenizer(&local_88);
  }
  std::__cxx11::string::~string((string *)(local_118 + 0x50));
  return;
}

Assistant:

void DumpReader::readFrameProperties(std::istream& inputStream) {
    Snapshot* s = info_->getSnapshotManager()->getCurrentSnapshot();
    // We're about to overwrite all frame properties, so clear out any
    // derived properties from previous use:
    s->clearDerivedProperties();

    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }

      StringTokenizer tokenizer(line, " ;\t\n\r{}:,");
      if (!tokenizer.hasMoreTokens()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
        painCave.isFatal = 1;
        simError();
      }

      std::string propertyName = tokenizer.nextToken();
      if (propertyName == "Time") {
        RealType currTime = tokenizer.nextTokenAsDouble();
        s->setTime(currTime);
      } else if (propertyName == "Hmat") {
        Mat3x3d hmat;
        hmat(0, 0) = tokenizer.nextTokenAsDouble();
        hmat(0, 1) = tokenizer.nextTokenAsDouble();
        hmat(0, 2) = tokenizer.nextTokenAsDouble();
        hmat(1, 0) = tokenizer.nextTokenAsDouble();
        hmat(1, 1) = tokenizer.nextTokenAsDouble();
        hmat(1, 2) = tokenizer.nextTokenAsDouble();
        hmat(2, 0) = tokenizer.nextTokenAsDouble();
        hmat(2, 1) = tokenizer.nextTokenAsDouble();
        hmat(2, 2) = tokenizer.nextTokenAsDouble();
        s->setHmat(hmat);
      } else if (propertyName == "Thermostat") {
        pair<RealType, RealType> thermostat;
        thermostat.first  = tokenizer.nextTokenAsDouble();
        thermostat.second = tokenizer.nextTokenAsDouble();
        s->setThermostat(thermostat);
      } else if (propertyName == "Barostat") {
        Mat3x3d eta;
        eta(0, 0) = tokenizer.nextTokenAsDouble();
        eta(0, 1) = tokenizer.nextTokenAsDouble();
        eta(0, 2) = tokenizer.nextTokenAsDouble();
        eta(1, 0) = tokenizer.nextTokenAsDouble();
        eta(1, 1) = tokenizer.nextTokenAsDouble();
        eta(1, 2) = tokenizer.nextTokenAsDouble();
        eta(2, 0) = tokenizer.nextTokenAsDouble();
        eta(2, 1) = tokenizer.nextTokenAsDouble();
        eta(2, 2) = tokenizer.nextTokenAsDouble();
        s->setBarostat(eta);
      } else if (propertyName == "SPFData") {
        std::shared_ptr<SPFData> spfData = s->getSPFData();

        spfData->pos[0]   = tokenizer.nextTokenAsDouble();
        spfData->pos[1]   = tokenizer.nextTokenAsDouble();
        spfData->pos[2]   = tokenizer.nextTokenAsDouble();
        spfData->lambda   = tokenizer.nextTokenAsDouble();
        spfData->globalID = tokenizer.nextTokenAsInt();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an invalid property in <FrameData>\n",
                 propertyName.c_str());
        painCave.isFatal = 0;
        simError();
      }
    }
  }